

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O2

void __thiscall cmCTestHG::LogParser::EndElement(LogParser *this,string *name)

{
  pointer pCVar1;
  bool bVar2;
  long lVar3;
  pointer pcVar4;
  string *psVar5;
  uint uVar6;
  ulong uVar7;
  string added_paths;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  
  bVar2 = std::operator==(name,"logentry");
  if (bVar2) {
    (*(this->HG->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[8])
              (this->HG,&this->Rev,&this->Changes);
  }
  else if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start !=
           (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish) {
    bVar2 = std::operator==(name,"author");
    pcVar4 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (bVar2) {
      psVar5 = &(this->Rev).Author;
    }
    else {
      if (pcVar4 == (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish) goto LAB_002fb4ff;
      bVar2 = std::operator==(name,"email");
      pcVar4 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (bVar2) {
        psVar5 = &(this->Rev).EMail;
      }
      else {
        if (pcVar4 == (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish) goto LAB_002fb4ff;
        bVar2 = std::operator==(name,"date");
        pcVar4 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (bVar2) {
          psVar5 = &(this->Rev).Date;
        }
        else {
          if (pcVar4 == (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish) goto LAB_002fb4ff;
          bVar2 = std::operator==(name,"msg");
          pcVar4 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (!bVar2) {
            if (pcVar4 != (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish) {
              bVar2 = std::operator==(name,"files");
              if (bVar2) {
                SplitCData_abi_cxx11_(&paths,this);
                for (uVar6 = 0;
                    (ulong)uVar6 <
                    (ulong)((long)paths.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)paths.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5); uVar6 = uVar6 + 1
                    ) {
                  added_paths._M_dataplus._M_p._0_1_ = 0x55;
                  added_paths._M_string_length = (long)&added_paths.field_2 + 8;
                  added_paths.field_2._M_allocated_capacity = 0;
                  added_paths.field_2._M_local_buf[8] = '\0';
                  cmCTestGlobalVC::Change::operator=(&this->CurChange,(Change *)&added_paths);
                  std::__cxx11::string::~string((string *)&added_paths._M_string_length);
                  std::__cxx11::string::_M_assign((string *)&(this->CurChange).Path);
                  std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::
                  push_back(&this->Changes,&this->CurChange);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&paths);
              }
              else if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start !=
                       (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish) {
                bVar2 = std::operator==(name,"file_adds");
                if (bVar2) {
                  added_paths._M_dataplus._M_p = (pointer)&added_paths.field_2;
                  std::__cxx11::string::
                  _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                            ((string *)&added_paths);
                  uVar6 = 0;
                  while( true ) {
                    uVar7 = (ulong)uVar6;
                    pCVar1 = (this->Changes).
                             super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    if ((ulong)(((long)(this->Changes).
                                       super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) /
                               0x28) <= uVar7) break;
                    lVar3 = std::__cxx11::string::find
                                      ((string *)&added_paths,(ulong)&pCVar1[uVar7].Path);
                    if (lVar3 != -1) {
                      (this->Changes).
                      super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar7].Action = 'A';
                    }
                    uVar6 = uVar6 + 1;
                  }
                }
                else {
                  if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start ==
                      (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish) goto LAB_002fb4ff;
                  bVar2 = std::operator==(name,"file_dels");
                  if (!bVar2) goto LAB_002fb4ff;
                  added_paths._M_dataplus._M_p = (pointer)&added_paths.field_2;
                  std::__cxx11::string::
                  _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                            ((string *)&added_paths,
                             (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start,
                             (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish);
                  uVar6 = 0;
                  while( true ) {
                    uVar7 = (ulong)uVar6;
                    pCVar1 = (this->Changes).
                             super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    if ((ulong)(((long)(this->Changes).
                                       super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) /
                               0x28) <= uVar7) break;
                    lVar3 = std::__cxx11::string::find
                                      ((string *)&added_paths,(ulong)&pCVar1[uVar7].Path);
                    if (lVar3 != -1) {
                      (this->Changes).
                      super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar7].Action = 'D';
                    }
                    uVar6 = uVar6 + 1;
                  }
                }
                std::__cxx11::string::~string((string *)&added_paths);
              }
            }
            goto LAB_002fb4ff;
          }
          psVar5 = &(this->Rev).Log;
        }
      }
    }
    std::__cxx11::string::assign((char *)psVar5,(ulong)pcVar4);
  }
LAB_002fb4ff:
  pcVar4 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish != pcVar4) {
    (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar4;
  }
  return;
}

Assistant:

virtual void EndElement(const std::string& name)
    {
    if(name == "logentry")
      {
      this->HG->DoRevision(this->Rev, this->Changes);
      }
    else if(!this->CData.empty() && name == "author")
      {
      this->Rev.Author.assign(&this->CData[0], this->CData.size());
      }
    else if(!this->CData.empty() && name == "email")
      {
      this->Rev.EMail.assign(&this->CData[0], this->CData.size());
      }
    else if(!this->CData.empty() && name == "date")
      {
      this->Rev.Date.assign(&this->CData[0], this->CData.size());
      }
    else if(!this->CData.empty() && name == "msg")
      {
      this->Rev.Log.assign(&this->CData[0], this->CData.size());
      }
    else if(!this->CData.empty() && name == "files")
      {
      std::vector<std::string> paths = this->SplitCData();
      for(unsigned int i = 0; i < paths.size(); ++i)
        {
        // Updated by default, will be modified using file_adds and
        // file_dels.
        this->CurChange = Change('U');
        this->CurChange.Path = paths[i];
        this->Changes.push_back(this->CurChange);
        }
      }
    else if(!this->CData.empty() && name == "file_adds")
      {
      std::string added_paths(this->CData.begin(), this->CData.end());
      for(unsigned int i = 0; i < this->Changes.size(); ++i)
        {
        if(added_paths.find(this->Changes[i].Path) != std::string::npos)
          {
          this->Changes[i].Action = 'A';
          }
        }
      }
     else if(!this->CData.empty() && name == "file_dels")
      {
      std::string added_paths(this->CData.begin(), this->CData.end());
      for(unsigned int i = 0; i < this->Changes.size(); ++i)
        {
        if(added_paths.find(this->Changes[i].Path) != std::string::npos)
          {
          this->Changes[i].Action = 'D';
          }
        }
      }
    this->CData.clear();
    }